

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTConstructCallAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  JsRTConstructCallAction *pJVar4;
  RecyclableObject *pRVar5;
  ScriptContext *pSVar6;
  JavascriptFunction *v;
  ThreadContext *threadContext;
  undefined4 *puVar7;
  Arguments local_a0;
  undefined1 local_90 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var res;
  undefined1 local_70 [8];
  Arguments jsArgs;
  CallInfo callInfo;
  JavascriptFunction *jsFunction;
  RecyclableObject *__obj_1;
  Var argi;
  uint32 i;
  RecyclableObject *__obj;
  Var jsFunctionVar;
  JsRTConstructCallAction *ccAction;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar4 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                     (evt);
  __obj = (RecyclableObject *)InflateVarInReplay(executeContext,*pJVar4->ArgArray);
  if ((__obj != (RecyclableObject *)0x0) &&
     (bVar2 = Js::VarIs<Js::JavascriptFunction>(__obj), bVar2)) {
    pRVar5 = Js::VarTo<Js::RecyclableObject>(__obj);
    pSVar6 = Js::RecyclableObject::GetScriptContext(pRVar5);
    if (pSVar6 != scriptContext) {
      __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
    }
    for (argi._4_4_ = 1; argi._4_4_ < pJVar4->ArgCount; argi._4_4_ = argi._4_4_ + 1) {
      __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pJVar4->ArgArray[argi._4_4_]);
      if (__obj_1 == (RecyclableObject *)0x0) {
        return;
      }
      bVar2 = Js::VarIs<Js::RecyclableObject>(__obj_1);
      if (bVar2) {
        pRVar5 = Js::VarTo<Js::RecyclableObject>(__obj_1);
        pSVar6 = Js::RecyclableObject::GetScriptContext(pRVar5);
        if (pSVar6 != scriptContext) {
          __obj_1 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
        }
      }
      pJVar4->ExecArgs[argi._4_4_ - 1] = __obj_1;
    }
    v = Js::VarTo<Js::JavascriptFunction>(__obj);
    Js::CallInfo::CallInfo((CallInfo *)&jsArgs.Values,CallFlags_New,pJVar4->ArgCount - 1 & 0xffff);
    Js::Arguments::Arguments((Arguments *)local_70,(CallInfo)jsArgs.Values,pJVar4->ExecArgs);
    autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
    autoReentrancyHandler._9_7_ = 0;
    threadContext = Js::ScriptContext::GetThreadContext(scriptContext);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_90,threadContext);
    Js::Arguments::Arguments(&local_a0,(Arguments *)local_70);
    autoReentrancyHandler._8_8_ =
         Js::JavascriptFunction::CallAsConstructor
                   (v,(Var)0x0,&local_a0,scriptContext,(AuxArray<unsigned_int> *)0x0);
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_90);
    if ((autoReentrancyHandler._8_8_ != 0) &&
       (BVar3 = Js::CrossSite::NeedMarshalVar((Var)autoReentrancyHandler._8_8_,scriptContext),
       BVar3 != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                         ,0x369,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                         "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
              (executeContext,evt,(Var)autoReentrancyHandler._8_8_);
  }
  return;
}

Assistant:

void JsRTConstructCallAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            Js::Var jsFunctionVar = InflateVarInReplay(executeContext, ccAction->ArgArray[0]);
            TTD_REPLAY_VALIDATE_INCOMING_FUNCTION(jsFunctionVar, ctx);

            //remove implicit constructor function as first arg in callInfo and argument loop below
            for (uint32 i = 1; i < ccAction->ArgCount; ++i)
            {
                Js::Var argi = InflateVarInReplay(executeContext, ccAction->ArgArray[i]);
                TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(argi, ctx);

                ccAction->ExecArgs[i - 1] = argi;
            }

            Js::JavascriptFunction* jsFunction = Js::VarTo<Js::JavascriptFunction>(jsFunctionVar);
            Js::CallInfo callInfo(Js::CallFlags::CallFlags_New, (ushort)(ccAction->ArgCount - 1));
            Js::Arguments jsArgs(callInfo, ccAction->ExecArgs);

            //
            //TODO: we will want to look at this at some point -- either treat as "top-level" call or maybe constructors are fast so we can just jump back to previous "real" code
            //TTDAssert(!Js::VarIs<Js::ScriptFunction>(jsFunction) || execContext->GetThreadContext()->TTDRootNestingCount != 0, "This will cause user code to execute and we need to add support for that as a top-level call source!!!!");
            //

            Js::Var res = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(ctx->GetThreadContext())
            {
                res = Js::JavascriptFunction::CallAsConstructor(jsFunction, /* overridingNewTarget = */nullptr, jsArgs, ctx);
            }
            END_SAFE_REENTRANT_CALL
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(executeContext, evt, res);
        }